

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
StringInstance::op_substringFromIndex_toIndex
          (string *__return_storage_ptr__,StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  string *value;
  long lVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  char *pcVar9;
  string local_d0;
  string local_b0;
  IntegerInstance local_90;
  
  value = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)value == 0x40) {
    IntegerInstance::IntegerInstance(&local_90,value);
    iVar4 = local_90._value;
    CharacterInstance::~CharacterInstance((CharacterInstance *)&local_90);
    IntegerInstance::IntegerInstance
              (&local_90,
               (arguments->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    CharacterInstance::~CharacterInstance((CharacterInstance *)&local_90);
    if ((((-1 < iVar4) && (uVar2 = (uint)(this->_value)._M_string_length, iVar4 <= (int)uVar2)) &&
        (-1 < local_90._value)) &&
       (((uint)local_90._value <= uVar2 && (-1 < local_90._value - iVar4)))) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&this->_value);
      str_utils::escape(&local_d0,&local_b0,'\"');
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x159d93);
      p_Var1 = &local_90.super_Instance.super_enable_shared_from_this<Instance>._M_weak_this.
                super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      plVar7 = plVar5 + 2;
      if ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)*plVar5 ==
          (__weak_count<(__gnu_cxx::_Lock_policy)2> *)plVar7) {
        local_90.super_Instance.super_enable_shared_from_this<Instance>._M_weak_this.
        super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7;
        local_90.super_Instance._type._M_dataplus._M_p = (pointer)plVar5[3];
        local_90.super_Instance._vptr_Instance = (_func_int **)p_Var1;
      }
      else {
        local_90.super_Instance.super_enable_shared_from_this<Instance>._M_weak_this.
        super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7;
        local_90.super_Instance._vptr_Instance = (_func_int **)*plVar5;
      }
      local_90.super_Instance.super_enable_shared_from_this<Instance>._M_weak_this.
      super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar8) {
        lVar3 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)local_90.super_Instance._vptr_Instance !=
          p_Var1) {
        operator_delete(local_90.super_Instance._vptr_Instance);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar9 = "RuntimeError: invalid argument.";
  }
  else {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar9 = "RuntimeError: wrong number of arguments.";
  }
  *puVar6 = pcVar9;
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_substringFromIndex_toIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    int to_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index < 0 || to_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index - from_index < 0)
        throw EXC_INVALID_ARGUMENT;
    return "\"" + str_utils::escape(_value.substr(from_index, to_index - from_index), '"') + "\"";
}